

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O1

bool __thiscall DataRefs::SetDefaultAcIcaoType(DataRefs *this,string *type)

{
  Doc8643 *pDVar1;
  bool bVar2;
  bool bVar3;
  
  pDVar1 = Doc8643::get(type);
  bVar2 = (pDVar1->model)._M_string_length != 0;
  bVar3 = DOC8643_EMPTY.model._M_string_length != 0;
  if (bVar2 == bVar3) {
    if ((int)dataRefs.iLogLevel < 3) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
             ,0x992,"SetDefaultAcIcaoType",logWARN,
             "A/c default ICAO type \'%s\' invalid, still using \'%s\' as default. Verify Settings > CSL!"
             ,(type->_M_dataplus)._M_p,(this->sDefaultAcIcaoType)._M_dataplus._M_p);
    }
    CreateMsgWindow(8.0,logWARN,
                    "A/c default ICAO type \'%s\' invalid, still using \'%s\' as default. Verify Settings > CSL!"
                    ,(type->_M_dataplus)._M_p,(this->sDefaultAcIcaoType)._M_dataplus._M_p);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&this->sDefaultAcIcaoType);
    XPMPSetDefaultPlaneICAO((type->_M_dataplus)._M_p,(char *)0x0);
    if ((int)dataRefs.iLogLevel < 2) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/DataRefs.cpp"
             ,0x98c,"SetDefaultAcIcaoType",logINFO,"Default a/c type is \'%s\'",
             (this->sDefaultAcIcaoType)._M_dataplus._M_p);
    }
  }
  return bVar2 != bVar3;
}

Assistant:

bool DataRefs::SetDefaultAcIcaoType(const std::string type)
{
    if (Doc8643::get(type) != DOC8643_EMPTY) {
        sDefaultAcIcaoType = type;
        XPMPSetDefaultPlaneICAO(type.c_str());  // inform libxplanemp
        LOG_MSG(logINFO,CFG_DEFAULT_AC_TYP_INFO,sDefaultAcIcaoType.c_str());
        return true;
    }

    // invalid type
    SHOW_MSG(logWARN,ERR_CFG_AC_DEFAULT,type.c_str(),
             sDefaultAcIcaoType.c_str());
    return false;
}